

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall Clasp::Solver::removeWatch(Solver *this,Literal *p,ClauseHead *h)

{
  size_type *psVar1;
  buf_type *pbVar2;
  bool bVar3;
  uint uVar4;
  ClauseWatch *__dest;
  ClauseWatch *pCVar5;
  WatchList *wl;
  
  uVar4 = p->rep_ >> 1;
  if (uVar4 < (this->watches_).ebo_.size) {
    wl = (this->watches_).ebo_.buf + uVar4;
    if ((this->lazyRem_ == (Dirty *)0x0) ||
       (bVar3 = Dirty::add(this->lazyRem_,(Literal)p->rep_,wl,h), !bVar3)) {
      pbVar2 = (wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
      __dest = std::
               __find_if<Clasp::ClauseWatch*,__gnu_cxx::__ops::_Iter_pred<Clasp::ClauseWatch::EqHead>>
                         (pbVar2,pbVar2 + (wl->super_type).
                                          super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>
                                          .left_,h);
      pCVar5 = (ClauseWatch *)
               ((wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_
               + (wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                 left_);
      if (pCVar5 != __dest) {
        memmove(__dest,__dest + 1,(long)pCVar5 - (long)(__dest + 1));
        psVar1 = &(wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                  left_;
        *psVar1 = *psVar1 - 8;
      }
    }
  }
  return;
}

Assistant:

void Solver::removeWatch(const Literal& p, ClauseHead* h) {
	if (!validWatch(p)) { return; }
	WatchList& pList = watches_[p.id()];
	if (!lazyRem_ || !lazyRem_->add(p, pList, h)) {
		pList.erase_left(std::find_if(pList.left_begin(), pList.left_end(), ClauseWatch::EqHead(h)));
	}
}